

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * CTcPrsOpUnary::parse_inherited(void)

{
  bool bVar1;
  tc_toktyp_t tVar2;
  CTcToken *pCVar3;
  CTcFormalTypeList *this;
  CTcTokenizer *this_00;
  undefined8 *puVar4;
  CTcPrsNode *pCVar5;
  int done;
  CTcFormalTypeList *tl;
  CTcPrsNode *lhs;
  CTcPrsMem *in_stack_ffffffffffffff78;
  int iVar6;
  CTcTokenizer *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  tc_toktyp_t in_stack_ffffffffffffff8c;
  CTPNInhClass *in_stack_ffffffffffffff90;
  CTcFormalTypeList *this_01;
  CTcPrsNode *in_stack_fffffffffffffff8;
  
  tVar2 = CTcTokenizer::next((CTcTokenizer *)
                             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  if (tVar2 == TOKT_SYM) {
    CTcPrsAllocObj::operator_new(0x2ac97f);
    pCVar3 = CTcTokenizer::getcur(G_tok);
    CTcToken::get_text(pCVar3);
    pCVar3 = CTcTokenizer::getcur(G_tok);
    CTcToken::get_text_len(pCVar3);
    CTPNInhClass::CTPNInhClass
              (in_stack_ffffffffffffff90,
               (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
               (size_t)in_stack_ffffffffffffff80);
    CTcParser::set_full_method_ctx_referenced(G_prs,1);
    CTcTokenizer::next((CTcTokenizer *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)
                      );
  }
  else if (tVar2 == TOKT_LT) {
    this = (CTcFormalTypeList *)
           operator_new((size_t)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    CTcFormalTypeList::CTcFormalTypeList(this);
    CTcTokenizer::next((CTcTokenizer *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)
                      );
    bVar1 = false;
LAB_002aca7e:
    iVar6 = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
    if (!bVar1) {
      tVar2 = CTcTokenizer::cur((CTcTokenizer *)0x2acaa0);
      iVar6 = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
      switch(tVar2) {
      case TOKT_EOF:
      case TOKT_RPAR:
      case TOKT_SEM:
        CTcTokenizer::log_error_curtok(in_stack_ffffffffffffff80,iVar6);
        return (CTcPrsNode *)0x0;
      default:
        CTcTokenizer::log_error_curtok(in_stack_ffffffffffffff80,iVar6);
        CTcParser::skip_to_sem();
        return (CTcPrsNode *)0x0;
      case TOKT_SYM:
        this_01 = this;
        CTcTokenizer::getcur(G_tok);
        CTcFormalTypeList::add_typed_param
                  (this_01,(CTcToken *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)
                  );
        break;
      case TOKT_LPAR:
        CTcTokenizer::log_error_curtok(in_stack_ffffffffffffff80,iVar6);
        bVar1 = true;
        goto LAB_002aca7e;
      case TOKT_COMMA:
        CTcTokenizer::log_error_curtok(in_stack_ffffffffffffff80,iVar6);
        CTcTokenizer::next((CTcTokenizer *)
                           CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        goto LAB_002aca7e;
      case TOKT_TIMES:
        CTcFormalTypeList::add_untyped_param((CTcFormalTypeList *)in_stack_ffffffffffffff80);
        break;
      case TOKT_GT:
        CTcTokenizer::next((CTcTokenizer *)
                           CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        bVar1 = true;
        goto LAB_002aca7e;
      case TOKT_ELLIPSIS:
        goto switchD_002acac6_caseD_45;
      }
      in_stack_ffffffffffffff8c =
           CTcTokenizer::next((CTcTokenizer *)
                              CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      iVar6 = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
      if (in_stack_ffffffffffffff8c != TOKT_SYM) {
        if (in_stack_ffffffffffffff8c == TOKT_COMMA) {
          CTcTokenizer::next((CTcTokenizer *)CONCAT44(0x15,in_stack_ffffffffffffff88));
          goto LAB_002aca7e;
        }
        if (in_stack_ffffffffffffff8c != TOKT_TIMES) {
          if (in_stack_ffffffffffffff8c == TOKT_GT) {
            CTcTokenizer::next((CTcTokenizer *)CONCAT44(0x23,in_stack_ffffffffffffff88));
            bVar1 = true;
            goto LAB_002aca7e;
          }
          if (in_stack_ffffffffffffff8c != TOKT_ELLIPSIS) {
            CTcTokenizer::log_error_curtok(in_stack_ffffffffffffff80,iVar6);
            CTcTokenizer::next((CTcTokenizer *)
                               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
            goto LAB_002aca7e;
          }
        }
      }
      CTcTokenizer::log_error_curtok(in_stack_ffffffffffffff80,iVar6);
      goto LAB_002aca7e;
    }
    this_00 = (CTcTokenizer *)CTcPrsAllocObj::operator_new(0x2accba);
    *(undefined8 *)this_00 = 0;
    this_00->res_loader_ = (CResLoader *)0x0;
    CTPNInh::CTPNInh((CTPNInh *)this_00);
    CTPNInhBase::set_typelist((CTPNInhBase *)this_00,this);
    tVar2 = CTcTokenizer::cur((CTcTokenizer *)0x2accfa);
    if (tVar2 != TOKT_LPAR) {
      CTcTokenizer::log_error_curtok(this_00,iVar6);
      CTcParser::skip_to_sem();
      return (CTcPrsNode *)0x0;
    }
  }
  else {
    puVar4 = (undefined8 *)CTcPrsAllocObj::operator_new(0x2acd57);
    *puVar4 = 0;
    puVar4[1] = 0;
    CTPNInh::CTPNInh((CTPNInh *)in_stack_ffffffffffffff80);
    CTcParser::set_full_method_ctx_referenced(G_prs,1);
  }
  pCVar5 = parse_member(in_stack_fffffffffffffff8);
  return pCVar5;
switchD_002acac6_caseD_45:
  CTcFormalTypeList::add_ellipsis(this);
  tVar2 = CTcTokenizer::next((CTcTokenizer *)
                             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  if (tVar2 == TOKT_GT) {
    CTcTokenizer::next((CTcTokenizer *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)
                      );
  }
  else {
    CTcTokenizer::log_error_curtok
              (in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
  }
  bVar1 = true;
  goto LAB_002aca7e;
}

Assistant:

CTcPrsNode *CTcPrsOpUnary::parse_inherited()
{
    CTcPrsNode *lhs;
    
    /* skip the "inherited" keyword and check what follows */
    switch(G_tok->next())
    {
    case TOKT_SYM:
        /* 
         *   it's an "inherited superclass..." expression - set up the
         *   "inherited superclass" node 
         */
        lhs = new CTPNInhClass(G_tok->getcur()->get_text(),
                               G_tok->getcur()->get_text_len());

        /* this passes method context information to the inheritor */
        G_prs->set_full_method_ctx_referenced(TRUE);

        /* skip the superclass token */
        G_tok->next();

        /* parse the member expression portion normally */
        break;

    case TOKT_LT:
        /* 
         *   '<' - this is the start of a multi-method type list.  Parse the
         *   list: type1 ',' type2 ',' ... '>', then the argument list to the
         *   'inherited' call.  
         */
        {
            /* create the formal type list */
            CTcFormalTypeList *tl = new (G_prsmem)CTcFormalTypeList();

            /* skip the '<' */
            G_tok->next();

            /* parse each list element */
            for (int done = FALSE ; !done ; )
            {
                switch (G_tok->cur())
                {
                case TOKT_GT:
                    /* end of the list - skip the '>', and we're done */
                    G_tok->next();
                    done = TRUE;
                    break;

                case TOKT_ELLIPSIS:
                    /* '...' */
                    tl->add_ellipsis();

                    /* this has to be the end of the list */
                    if (G_tok->next() == TOKT_GT)
                        G_tok->next();
                    else
                        G_tok->log_error_curtok(TCERR_MMINH_MISSING_GT);

                    /* assume the list ends here in any case */
                    done = TRUE;
                    break;

                case TOKT_SYM:
                    /* a type token - add it to the list */
                    tl->add_typed_param(G_tok->getcur());

                finish_type:
                    /* skip the type token */
                    switch (G_tok->next())
                    {
                    case TOKT_COMMA:
                        /* another type follows */
                        G_tok->next();
                        break;

                    case TOKT_GT:
                        G_tok->next();
                        done = TRUE;
                        break;

                    case TOKT_SYM:
                    case TOKT_ELLIPSIS:
                    case TOKT_TIMES:
                        /* probably just a missing comma */
                        G_tok->log_error_curtok(TCERR_MMINH_MISSING_COMMA);
                        break;

                    default:
                        /* anything else is an error */
                        G_tok->log_error_curtok(TCERR_MMINH_MISSING_COMMA);
                        G_tok->next();
                        break;
                    }
                    break;

                case TOKT_TIMES:
                    /* '*' indicates an untyped parameter */
                    tl->add_untyped_param();
                    goto finish_type;

                case TOKT_LPAR:
                    /* probably a missing '>' */
                    G_tok->log_error_curtok(TCERR_MMINH_MISSING_GT);
                    done = TRUE;
                    break;

                case TOKT_COMMA:
                    /* probably a missing type */
                    G_tok->log_error_curtok(TCERR_MMINH_MISSING_ARG_TYPE);
                    G_tok->next();
                    break;

                case TOKT_SEM:
                case TOKT_RPAR:
                case TOKT_EOF:
                    /* all of these indicate a premature end of the list */
                    G_tok->log_error_curtok(TCERR_MMINH_MISSING_ARG_TYPE);
                    return 0;

                default:
                    /* anything else is an error */
                    G_tok->log_error_curtok(TCERR_MMINH_MISSING_ARG_TYPE);
                    G_prs->skip_to_sem();
                    return 0;
                }
            }

            /* the left-hand side is an "inherited" node, with the arg list */
            lhs = new CTPNInh();
            ((CTPNInh *)lhs)->set_typelist(tl);

            /* an inherited<> expression must have an argument list */
            if (G_tok->cur() != TOKT_LPAR)
            {
                G_tok->log_error_curtok(TCERR_MMINH_MISSING_ARG_LIST);
                G_prs->skip_to_sem();
                return 0;
            }
        }
        break;
        
    default:
        /*
         *   There's no explicit superclass name listed, so the left-hand
         *   side of the '.' expression is the simple "inherited" node. 
         */
        lhs = new CTPNInh();

        /*
         *   Since we don't have an explicit superclass, we'll need the
         *   method context at run-time to establish the next class in
         *   inheritance order.  Flag the need for the full method context.  
         */
        G_prs->set_full_method_ctx_referenced(TRUE);

        /* parse the member expression portion normally */
        break;
    }

    /* parse and return the member expression */
    return parse_member(lhs);
}